

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * Evaluate(ExpressionEvalContext *ctx,ExprBase *expression)

{
  uint uVar1;
  ExprBase *pEVar2;
  
  if ((expression->type == (TypeBase *)0x0) || (expression->type->typeID != 0)) {
    uVar1 = ctx->expressionDepth + 1;
    ctx->expressionDepth = uVar1;
    if (ctx->expressionDepthLimit < uVar1) {
      pEVar2 = (ExprBase *)0x0;
      Report(ctx,"ERROR: expression depth limit reached");
    }
    else {
      switch(expression->typeID) {
      case 0:
      case 1:
        pEVar2 = (ExprBase *)0x0;
        Report(ctx,"ERROR: invalid expression");
        break;
      case 2:
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x2e:
        pEVar2 = EvaluateVoid(ctx,expression);
        break;
      case 3:
        pEVar2 = EvaluateBoolLiteral(ctx,(ExprBoolLiteral *)expression);
        break;
      case 4:
        pEVar2 = EvaluateCharacterLiteral(ctx,(ExprCharacterLiteral *)expression);
        break;
      case 5:
        pEVar2 = EvaluateStringLiteral(ctx,(ExprStringLiteral *)expression);
        break;
      case 6:
        pEVar2 = EvaluateIntegerLiteral(ctx,(ExprIntegerLiteral *)expression);
        break;
      case 7:
        pEVar2 = EvaluateRationalLiteral(ctx,(ExprRationalLiteral *)expression);
        break;
      case 8:
        pEVar2 = EvaluateTypeLiteral(ctx,(ExprTypeLiteral *)expression);
        break;
      case 9:
        pEVar2 = EvaluateNullptrLiteral(ctx,(ExprNullptrLiteral *)expression);
        break;
      case 10:
        pEVar2 = EvaluateFunctionIndexLiteral(ctx,(ExprFunctionIndexLiteral *)expression);
        break;
      default:
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0xd11,"ExprBase *Evaluate(ExpressionEvalContext &, ExprBase *)");
      case 0xe:
      case 0x17:
        pEVar2 = Evaluate(ctx,(ExprBase *)expression[1]._vptr_ExprBase);
        break;
      case 0xf:
        pEVar2 = EvaluateArray(ctx,(ExprArray *)expression);
        break;
      case 0x10:
        pEVar2 = EvaluatePreModify(ctx,(ExprPreModify *)expression);
        break;
      case 0x11:
        pEVar2 = EvaluatePostModify(ctx,(ExprPostModify *)expression);
        break;
      case 0x12:
        pEVar2 = EvaluateCast(ctx,(ExprTypeCast *)expression);
        break;
      case 0x13:
        pEVar2 = EvaluateUnaryOp(ctx,(ExprUnaryOp *)expression);
        break;
      case 0x14:
        pEVar2 = EvaluateBinaryOp(ctx,(ExprBinaryOp *)expression);
        break;
      case 0x15:
        pEVar2 = EvaluateGetAddress(ctx,(ExprGetAddress *)expression);
        break;
      case 0x16:
        pEVar2 = EvaluateDereference(ctx,(ExprDereference *)expression);
        break;
      case 0x18:
        pEVar2 = EvaluateConditional(ctx,(ExprConditional *)expression);
        break;
      case 0x19:
        pEVar2 = EvaluateAssignment(ctx,(ExprAssignment *)expression);
        break;
      case 0x1a:
        pEVar2 = EvaluateMemberAccess(ctx,(ExprMemberAccess *)expression);
        break;
      case 0x1b:
        pEVar2 = EvaluateArrayIndex(ctx,(ExprArrayIndex *)expression);
        break;
      case 0x1c:
        pEVar2 = EvaluateReturn(ctx,(ExprReturn *)expression);
        break;
      case 0x1d:
        pEVar2 = EvaluateYield(ctx,(ExprYield *)expression);
        break;
      case 0x1e:
        pEVar2 = EvaluateVariableDefinition(ctx,(ExprVariableDefinition *)expression);
        break;
      case 0x1f:
        pEVar2 = EvaluateZeroInitialize(ctx,(ExprZeroInitialize *)expression);
        break;
      case 0x20:
        pEVar2 = EvaluateArraySetup(ctx,(ExprArraySetup *)expression);
        break;
      case 0x21:
        pEVar2 = EvaluateVariableDefinitions(ctx,(ExprVariableDefinitions *)expression);
        break;
      case 0x22:
        pEVar2 = EvaluateVariableAccess(ctx,(ExprVariableAccess *)expression);
        break;
      case 0x23:
        pEVar2 = EvaluateFunctionContextAccess(ctx,(ExprFunctionContextAccess *)expression);
        break;
      case 0x24:
        pEVar2 = EvaluateFunctionDefinition(ctx,(ExprFunctionDefinition *)expression);
        break;
      case 0x25:
        pEVar2 = EvaluateGenericFunctionPrototype(ctx,(ExprGenericFunctionPrototype *)expression);
        break;
      case 0x26:
        pEVar2 = EvaluateFunctionAccess(ctx,(ExprFunctionAccess *)expression);
        break;
      case 0x27:
      case 0x28:
        pEVar2 = (ExprBase *)0x0;
        break;
      case 0x29:
        pEVar2 = EvaluateFunctionCall(ctx,(ExprFunctionCall *)expression);
        break;
      case 0x2f:
        pEVar2 = EvaluateIfElse(ctx,(ExprIfElse *)expression);
        break;
      case 0x30:
        pEVar2 = EvaluateFor(ctx,(ExprFor *)expression);
        break;
      case 0x31:
        pEVar2 = EvaluateWhile(ctx,(ExprWhile *)expression);
        break;
      case 0x32:
        pEVar2 = EvaluateDoWhile(ctx,(ExprDoWhile *)expression);
        break;
      case 0x33:
        pEVar2 = EvaluateSwitch(ctx,(ExprSwitch *)expression);
        break;
      case 0x34:
        pEVar2 = EvaluateBreak(ctx,(ExprBreak *)expression);
        break;
      case 0x35:
        pEVar2 = EvaluateContinue(ctx,(ExprContinue *)expression);
        break;
      case 0x36:
        pEVar2 = EvaluateBlock(ctx,(ExprBlock *)expression);
        break;
      case 0x37:
        pEVar2 = EvaluateSequence(ctx,(ExprSequence *)expression);
        break;
      case 0x38:
        pEVar2 = EvaluateModule(ctx,(ExprModule *)expression);
      }
      ctx->expressionDepth = ctx->expressionDepth - 1;
    }
  }
  else {
    pEVar2 = (ExprBase *)0x0;
  }
  return pEVar2;
}

Assistant:

ExprBase* Evaluate(ExpressionEvalContext &ctx, ExprBase *expression)
{
	if(isType<TypeError>(expression->type))
		return NULL;

	ctx.expressionDepth++;

	if(ctx.expressionDepth > ctx.expressionDepthLimit)
		return Report(ctx, "ERROR: expression depth limit reached");

	ExprBase *result = NULL;

	switch(expression->typeID)
	{
	case ExprError::myTypeID:
		result = Report(ctx, "ERROR: invalid expression");
		break;
	case ExprErrorTypeMemberAccess::myTypeID:
		result = Report(ctx, "ERROR: invalid expression");
		break;
	case ExprVoid::myTypeID:
		result = EvaluateVoid(ctx, expression);
		break;
	case ExprBoolLiteral::myTypeID:
		result = EvaluateBoolLiteral(ctx, (ExprBoolLiteral*)expression);
		break;
	case ExprCharacterLiteral::myTypeID:
		result = EvaluateCharacterLiteral(ctx, (ExprCharacterLiteral*)expression);
		break;
	case ExprStringLiteral::myTypeID:
		result = EvaluateStringLiteral(ctx, (ExprStringLiteral*)expression);
		break;
	case ExprIntegerLiteral::myTypeID:
		result = EvaluateIntegerLiteral(ctx, (ExprIntegerLiteral*)expression);
		break;
	case ExprRationalLiteral::myTypeID:
		result = EvaluateRationalLiteral(ctx, (ExprRationalLiteral*)expression);
		break;
	case ExprTypeLiteral::myTypeID:
		result = EvaluateTypeLiteral(ctx, (ExprTypeLiteral*)expression);
		break;
	case ExprNullptrLiteral::myTypeID:
		result = EvaluateNullptrLiteral(ctx, (ExprNullptrLiteral*)expression);
		break;
	case ExprFunctionIndexLiteral::myTypeID:
		result = EvaluateFunctionIndexLiteral(ctx, (ExprFunctionIndexLiteral*)expression);
		break;
	case ExprPassthrough::myTypeID:
		result = Evaluate(ctx, ((ExprPassthrough*)expression)->value);
		break;
	case ExprArray::myTypeID:
		result = EvaluateArray(ctx, (ExprArray*)expression);
		break;
	case ExprPreModify::myTypeID:
		result = EvaluatePreModify(ctx, (ExprPreModify*)expression);
		break;
	case ExprPostModify::myTypeID:
		result = EvaluatePostModify(ctx, (ExprPostModify*)expression);
		break;
	case ExprTypeCast::myTypeID:
		result = EvaluateCast(ctx, (ExprTypeCast*)expression);
		break;
	case ExprUnaryOp::myTypeID:
		result = EvaluateUnaryOp(ctx, (ExprUnaryOp*)expression);
		break;
	case ExprBinaryOp::myTypeID:
		result = EvaluateBinaryOp(ctx, (ExprBinaryOp*)expression);
		break;
	case ExprGetAddress::myTypeID:
		result = EvaluateGetAddress(ctx, (ExprGetAddress*)expression);
		break;
	case ExprDereference::myTypeID:
		result = EvaluateDereference(ctx, (ExprDereference*)expression);
		break;
	case ExprUnboxing::myTypeID:
		result = Evaluate(ctx, ((ExprUnboxing*)expression)->value);
		break;
	case ExprConditional::myTypeID:
		result = EvaluateConditional(ctx, (ExprConditional*)expression);
		break;
	case ExprAssignment::myTypeID:
		result = EvaluateAssignment(ctx, (ExprAssignment*)expression);
		break;
	case ExprMemberAccess::myTypeID:
		result = EvaluateMemberAccess(ctx, (ExprMemberAccess*)expression);
		break;
	case ExprArrayIndex::myTypeID:
		result = EvaluateArrayIndex(ctx, (ExprArrayIndex*)expression);
		break;
	case ExprReturn::myTypeID:
		result = EvaluateReturn(ctx, (ExprReturn*)expression);
		break;
	case ExprYield::myTypeID:
		result = EvaluateYield(ctx, (ExprYield*)expression);
		break;
	case ExprVariableDefinition::myTypeID:
		result = EvaluateVariableDefinition(ctx, (ExprVariableDefinition*)expression);
		break;
	case ExprZeroInitialize::myTypeID:
		result = EvaluateZeroInitialize(ctx, (ExprZeroInitialize*)expression);
		break;
	case ExprArraySetup::myTypeID:
		result = EvaluateArraySetup(ctx, (ExprArraySetup*)expression);
		break;
	case ExprVariableDefinitions::myTypeID:
		result = EvaluateVariableDefinitions(ctx, (ExprVariableDefinitions*)expression);
		break;
	case ExprVariableAccess::myTypeID:
		result = EvaluateVariableAccess(ctx, (ExprVariableAccess*)expression);
		break;
	case ExprFunctionContextAccess::myTypeID:
		result = EvaluateFunctionContextAccess(ctx, (ExprFunctionContextAccess*)expression);
		break;
	case ExprFunctionDefinition::myTypeID:
		result = EvaluateFunctionDefinition(ctx, (ExprFunctionDefinition*)expression);
		break;
	case ExprGenericFunctionPrototype::myTypeID:
		result = EvaluateGenericFunctionPrototype(ctx, (ExprGenericFunctionPrototype*)expression);
		break;
	case ExprFunctionAccess::myTypeID:
		result = EvaluateFunctionAccess(ctx, (ExprFunctionAccess*)expression);
		break;
	case ExprFunctionOverloadSet::myTypeID:
		result = NULL;
		break;
	case ExprShortFunctionOverloadSet::myTypeID:
		result = NULL;
		break;
	case ExprFunctionCall::myTypeID:
		result = EvaluateFunctionCall(ctx, (ExprFunctionCall*)expression);
		break;
	case ExprAliasDefinition::myTypeID:
		result = EvaluateVoid(ctx, expression);
		break;
	case ExprClassPrototype::myTypeID:
		result = EvaluateVoid(ctx, expression);
		break;
	case ExprGenericClassPrototype::myTypeID:
		result = EvaluateVoid(ctx, expression);
		break;
	case ExprClassDefinition::myTypeID:
		result = EvaluateVoid(ctx, expression);
		break;
	case ExprEnumDefinition::myTypeID:
		result = EvaluateVoid(ctx, expression);
		break;
	case ExprIfElse::myTypeID:
		result = EvaluateIfElse(ctx, (ExprIfElse*)expression);
		break;
	case ExprFor::myTypeID:
		result = EvaluateFor(ctx, (ExprFor*)expression);
		break;
	case ExprWhile::myTypeID:
		result = EvaluateWhile(ctx, (ExprWhile*)expression);
		break;
	case ExprDoWhile::myTypeID:
		result = EvaluateDoWhile(ctx, (ExprDoWhile*)expression);
		break;
	case ExprSwitch::myTypeID:
		result = EvaluateSwitch(ctx, (ExprSwitch*)expression);
		break;
	case ExprBreak::myTypeID:
		result = EvaluateBreak(ctx, (ExprBreak*)expression);
		break;
	case ExprContinue::myTypeID:
		result = EvaluateContinue(ctx, (ExprContinue*)expression);
		break;
	case ExprBlock::myTypeID:
		result = EvaluateBlock(ctx, (ExprBlock*)expression);
		break;
	case ExprSequence::myTypeID:
		result = EvaluateSequence(ctx, (ExprSequence*)expression);
		break;
	case ExprModule::myTypeID:
		result = EvaluateModule(ctx, (ExprModule*)expression);
		break;
	default:
		assert(!"unknown type");
		break;
	}

	ctx.expressionDepth--;

	return result;
}